

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppRoleStrategy.cpp
# Opt level: O1

optional<Vault::AuthenticationResponse> * __thiscall
Vault::AppRoleStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,AppRoleStrategy *this,
          Client *client)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Path local_98;
  Url local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/login","");
  paVar1 = &local_98.value_.field_2;
  if (local_b8 == &local_a8) {
    local_98.value_.field_2._8_8_ = local_a8._8_8_;
    local_98.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.value_._M_dataplus._M_p = (pointer)local_b8;
  }
  local_98.value_.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_98.value_.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_98.value_._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_b8 = &local_a8;
  getUrl(&local_78,this,client,&local_98);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/AppRoleStrategy.cpp:7:54)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/AppRoleStrategy.cpp:7:54)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_78,(NoArgJsonProducer *)&local_58)
  ;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value_._M_dataplus._M_p != &local_78.value_.field_2) {
    operator_delete(local_78.value_._M_dataplus._M_p,
                    local_78.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.value_._M_dataplus._M_p,
                    local_98.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::AppRoleStrategy::authenticate(const Vault::Client &client) {
  return Vault::HttpConsumer::authenticate(
      client, getUrl(client, Vault::Path{"/login"}), [&]() {
        nlohmann::json j;
        j = nlohmann::json::object();
        j["role_id"] = roleId_.value();
        j["secret_id"] = secretId_.value();
        return j.dump();
      });
}